

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<double_const&>::captureExpression<(Catch::Internal::Operator)0,unsigned_long>
          (ExpressionLhs<double_const&> *this,unsigned_long *rhs)

{
  ResultBuilder *pRVar1;
  double *pdVar2;
  OfType OVar3;
  unsigned_long value;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  pdVar2 = *(double **)(this + 8);
  OVar3 = ExpressionFailed;
  if (((double)CONCAT44(0x45300000,(int)(*rhs >> 0x20)) - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)*rhs) - 4503599627370496.0) == *pdVar2) {
    OVar3 = Ok;
  }
  (pRVar1->m_data).resultType = OVar3;
  fpToString<double>(&local_38,*pdVar2,10);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)*rhs,value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"==","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }